

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
write_to_file(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  size_type local_230;
  size_t i;
  ostream local_218 [8];
  ofstream out;
  char *filename_local;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  local_230 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->sorted_vector_of_distances);
    if (local_230 == sVar1) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->sorted_vector_of_distances,local_230);
    poVar3 = (ostream *)std::ostream::operator<<(local_218,*pvVar2);
    std::operator<<(poVar3," ");
    local_230 = local_230 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::write_to_file(const char* filename) const {
  std::ofstream out;
  out.open(filename);

  for (size_t i = 0; i != this->sorted_vector_of_distances.size(); ++i) {
    out << this->sorted_vector_of_distances[i] << " ";
  }

  out.close();
}